

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Functional::RandomBufferWriteCase::iterate(RandomBufferWriteCase *this)

{
  BufferVerifier *this_00;
  bool bVar1;
  deUint32 dVar2;
  int iVar3;
  deInt32 x;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  TestLog *pTVar7;
  deUint8 *pdVar8;
  long lVar9;
  long size_00;
  TestError *this_01;
  pointer pVVar10;
  size_t in_R9;
  float fVar11;
  Enum<int,_2UL> EVar12;
  deUint8 *local_340;
  bool local_2fd;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_2c8;
  __normal_iterator<tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_2c0;
  __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
  local_2b8;
  const_iterator range;
  GetNameFunc local_298;
  int local_290;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  GLenum local_21c;
  deUint32 err;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> local_210;
  int local_1f8;
  int local_1f4;
  int offset;
  int size_1;
  byte local_1e5;
  deUint32 local_1e4;
  int iStack_1e0;
  bool fillWithData;
  deUint32 hint;
  int size;
  int iStack_1d4;
  bool respecify;
  deUint32 target;
  int uploadNdx;
  int local_1ac;
  string local_1a8;
  allocator<char> local_181;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  int local_fc;
  string local_f8;
  allocator<char> local_d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  LogSection local_90;
  undefined1 local_40 [8];
  Random rnd;
  deUint32 curBoundTarget;
  bool iterOk;
  float respecifyDataProbability;
  float respecifyProbability;
  int maxSize;
  int minSize;
  int uploadsPerIteration;
  int numIterations;
  RandomBufferWriteCase *this_local;
  
  minSize = 5;
  rnd.m_rnd.w._3_1_ = 1;
  rnd.m_rnd.z = 0;
  uVar6 = this->m_seed;
  _uploadsPerIteration = this;
  dVar2 = ::deInt32Hash(this->m_iterNdx);
  de::Random::Random((Random *)local_40,uVar6 ^ dVar2 ^ 0xacf92e);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Iteration",&local_d1);
  local_fc = this->m_iterNdx + 1;
  de::toString<int>(&local_f8,&local_fc);
  std::operator+(&local_b0,&local_d0,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"Iteration ",&local_181);
  local_1ac = this->m_iterNdx + 1;
  de::toString<int>(&local_1a8,&local_1ac);
  std::operator+(&local_160,&local_180,&local_1a8);
  std::operator+(&local_140,&local_160," / ");
  de::toString<int>((string *)&target,&minSize);
  std::operator+(&local_120,&local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&target);
  tcu::LogSection::LogSection(&local_90,&local_b0,&local_120);
  tcu::TestLog::operator<<(pTVar7,&local_90);
  tcu::LogSection::~LogSection(&local_90);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&target);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_180);
  std::allocator<char>::~allocator(&local_181);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  for (iStack_1d4 = 0; iStack_1d4 < 7; iStack_1d4 = iStack_1d4 + 1) {
    iVar3 = de::Random::getInt((Random *)local_40,0,1);
    size = iterate::bufferTargets[iVar3];
    local_2fd = true;
    if (this->m_curSize != 0) {
      fVar11 = de::Random::getFloat((Random *)local_40);
      local_2fd = fVar11 < 0.07;
    }
    hint._3_1_ = local_2fd;
    if (size != rnd.m_rnd.z) {
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,size,this->m_buffer);
      rnd.m_rnd.z = size;
    }
    if ((hint._3_1_ & 1) == 0) {
      iVar3 = this->m_curSize;
      fVar11 = de::Random::getFloat((Random *)local_40,0.0,0.7);
      fVar11 = deFloatPow(fVar11,3.0);
      x = ::deRoundFloatToInt32((float)iVar3 * fVar11);
      local_1f4 = de::clamp<int>(x,0xc,this->m_curSize);
      local_1f8 = de::Random::getInt((Random *)local_40,0,this->m_curSize - local_1f4);
      pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr(&this->m_refBuffer,0);
      iVar3 = local_1f4;
      lVar9 = (long)local_1f8;
      dVar2 = de::Random::getUint32((Random *)local_40);
      BufferTestUtil::fillWithRandomBytes(pdVar8 + lVar9,iVar3,dVar2);
      iVar3 = size;
      lVar9 = (long)local_1f8;
      size_00 = (long)local_1f4;
      pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr(&this->m_refBuffer,0);
      glu::CallLogWrapper::glBufferSubData
                (&(this->super_BufferCase).super_CallLogWrapper,iVar3,lVar9,size_00,
                 pdVar8 + local_1f8);
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&stack0xfffffffffffffde8,local_1f8,local_1f4);
      addRangeToList(&local_210,&this->m_validRanges,(IVec2 *)&stack0xfffffffffffffde8);
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator=
                (&this->m_validRanges,&local_210);
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector(&local_210);
    }
    else {
      iStack_1e0 = de::Random::getInt((Random *)local_40,0xc,0x8000);
      iVar3 = de::Random::getInt((Random *)local_40,0,2);
      local_1e4 = iterate::usageHints[iVar3];
      fVar11 = de::Random::getFloat((Random *)local_40);
      local_1e5 = fVar11 < 0.2;
      BufferTestUtil::ReferenceBuffer::setSize(&this->m_refBuffer,iStack_1e0);
      if ((local_1e5 & 1) != 0) {
        pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr(&this->m_refBuffer,0);
        iVar3 = iStack_1e0;
        dVar2 = de::Random::getUint32((Random *)local_40);
        BufferTestUtil::fillWithRandomBytes(pdVar8,iVar3,dVar2);
      }
      iVar3 = size;
      lVar9 = (long)iStack_1e0;
      if ((local_1e5 & 1) == 0) {
        local_340 = (deUint8 *)0x0;
      }
      else {
        local_340 = BufferTestUtil::ReferenceBuffer::getPtr(&this->m_refBuffer,0);
      }
      glu::CallLogWrapper::glBufferData
                (&(this->super_BufferCase).super_CallLogWrapper,iVar3,lVar9,local_340,local_1e4);
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::clear
                (&this->m_validRanges);
      if ((local_1e5 & 1) != 0) {
        tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&offset,0,iStack_1e0);
        std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                  (&this->m_validRanges,(value_type *)&offset);
      }
      this->m_curSize = iStack_1e0;
    }
  }
  local_21c = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  if (local_21c != 0) {
    range._M_current._7_1_ = 1;
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"Got ",&local_261);
    EVar12 = glu::getErrorStr(local_21c);
    local_298 = EVar12.m_getName;
    local_290 = EVar12.m_value;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_288,&local_298);
    std::operator+(&local_240,&local_260,&local_288);
    tcu::TestError::TestError(this_01,&local_240);
    range._M_current._7_1_ = 0;
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  local_2c0._M_current =
       (Vector<int,_2> *)
       std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::begin
                 (&this->m_validRanges);
  __gnu_cxx::
  __normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
  ::__normal_iterator<tcu::Vector<int,2>*>
            ((__normal_iterator<tcu::Vector<int,2>const*,std::vector<tcu::Vector<int,2>,std::allocator<tcu::Vector<int,2>>>>
              *)&local_2b8,&local_2c0);
  do {
    local_2c8._M_current =
         (Vector<int,_2> *)
         std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::end
                   (&this->m_validRanges);
    bVar1 = __gnu_cxx::operator!=(&local_2b8,&local_2c8);
    if (!bVar1) {
LAB_019d56f3:
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.
                          m_testCtx);
      tcu::TestLog::operator<<(pTVar7,(EndSectionToken *)&tcu::TestLog::EndSection);
      this->m_iterNdx = this->m_iterNdx + 1;
      bVar1 = false;
      if ((rnd.m_rnd.w._3_1_ & 1) != 0) {
        bVar1 = this->m_iterNdx < 5;
      }
      de::Random::~Random((Random *)local_40);
      return (uint)bVar1;
    }
    this_00 = this->m_verifier;
    uVar6 = this->m_buffer;
    pdVar8 = BufferTestUtil::ReferenceBuffer::getPtr(&this->m_refBuffer,0);
    pVVar10 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_2b8);
    uVar4 = tcu::Vector<int,_2>::x(pVVar10);
    pVVar10 = __gnu_cxx::
              __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
              ::operator->(&local_2b8);
    uVar5 = tcu::Vector<int,_2>::y(pVVar10);
    uVar6 = BufferTestUtil::BufferVerifier::verify
                      (this_00,(EVP_PKEY_CTX *)(ulong)uVar6,pdVar8,(ulong)uVar4,
                       (uchar *)(ulong)uVar5,in_R9);
    if ((uVar6 & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_FAIL,"Buffer verification failed");
      rnd.m_rnd.w._3_1_ = 0;
      goto LAB_019d56f3;
    }
    __gnu_cxx::
    __normal_iterator<const_tcu::Vector<int,_2>_*,_std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>_>
    ::operator++(&local_2b8,0);
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		// Parameters.
		const int	numIterations				= 5;
		const int	uploadsPerIteration			= 7;
		const int	minSize						= 12;
		const int	maxSize						= 32*1024;
		const float	respecifyProbability		= 0.07f;
		const float	respecifyDataProbability	= 0.2f;

		static const deUint32 bufferTargets[] =
		{
			GL_ARRAY_BUFFER,
			GL_ELEMENT_ARRAY_BUFFER
		};

		static const deUint32 usageHints[] =
		{
			GL_STREAM_DRAW,
			GL_STATIC_DRAW,
			GL_DYNAMIC_DRAW,
		};

		bool		iterOk					= true;
		deUint32	curBoundTarget			= GL_NONE;
		de::Random	rnd						(m_seed ^ deInt32Hash(m_iterNdx) ^ 0xacf92e);

		m_testCtx.getLog() << TestLog::Section(string("Iteration") + de::toString(m_iterNdx+1), string("Iteration ") + de::toString(m_iterNdx+1) + " / " + de::toString(numIterations));

		for (int uploadNdx = 0; uploadNdx < uploadsPerIteration; uploadNdx++)
		{
			const deUint32	target		= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
			const bool		respecify	= m_curSize == 0 || rnd.getFloat() < respecifyProbability;

			if (target != curBoundTarget)
			{
				glBindBuffer(target, m_buffer);
				curBoundTarget = target;
			}

			if (respecify)
			{
				const int		size			= rnd.getInt(minSize, maxSize);
				const deUint32	hint			= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
				const bool		fillWithData	= rnd.getFloat() < respecifyDataProbability;

				m_refBuffer.setSize(size);
				if (fillWithData)
					fillWithRandomBytes(m_refBuffer.getPtr(), size, rnd.getUint32());

				glBufferData(target, size, fillWithData ? m_refBuffer.getPtr() : DE_NULL, hint);

				m_validRanges.clear();
				if (fillWithData)
					m_validRanges.push_back(tcu::IVec2(0, size));

				m_curSize = size;
			}
			else
			{
				// \note Non-uniform size distribution.
				const int	size	= de::clamp(deRoundFloatToInt32((float)m_curSize * deFloatPow(rnd.getFloat(0.0f, 0.7f), 3.0f)), minSize, m_curSize);
				const int	offset	= rnd.getInt(0, m_curSize-size);

				fillWithRandomBytes(m_refBuffer.getPtr()+offset, size, rnd.getUint32());
				glBufferSubData(target, offset, size, m_refBuffer.getPtr()+offset);

				m_validRanges = addRangeToList(m_validRanges, tcu::IVec2(offset, size));
			}
		}

		// Check error.
		{
			deUint32 err = glGetError();
			if (err != GL_NO_ERROR)
				throw tcu::TestError(string("Got ") + glu::getErrorStr(err).toString());
		}

		// Verify valid ranges.
		for (vector<IVec2>::const_iterator range = m_validRanges.begin(); range != m_validRanges.end(); range++)
		{
			if (!m_verifier->verify(m_buffer, m_refBuffer.getPtr(), range->x(), range->y()))
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Buffer verification failed");
				iterOk = false;
				break;
			}
		}

		m_testCtx.getLog() << TestLog::EndSection;

		DE_ASSERT(iterOk || m_testCtx.getTestResult() != QP_TEST_RESULT_PASS);

		m_iterNdx += 1;
		return (iterOk && m_iterNdx < numIterations) ? CONTINUE : STOP;
	}